

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

void __thiscall QTextStream::QTextStream(QTextStream *this,QByteArray *array,OpenMode openMode)

{
  long lVar1;
  QObject *parent;
  QByteArray *data;
  QTextStreamPrivate *pQVar2;
  undefined4 in_EDX;
  QDeviceClosedNotifier *in_RDI;
  long in_FS_OFFSET;
  QTextStreamPrivate *d;
  QBuffer *buffer;
  pointer in_stack_ffffffffffffff98;
  unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>
  *in_stack_ffffffffffffffa0;
  QByteArray *device;
  QTextStream *stream;
  QBuffer *in_stack_ffffffffffffffc0;
  QDeviceClosedNotifier *q_ptr;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->super_QObject)._vptr_QObject = (_func_int **)&PTR__QTextStream_00be7f68;
  stream = (QTextStream *)&(in_RDI->super_QObject).d_ptr;
  q_ptr = in_RDI;
  parent = (QObject *)operator_new(0x168);
  QTextStreamPrivate::QTextStreamPrivate
            ((QTextStreamPrivate *)CONCAT44(in_EDX,in_stack_fffffffffffffff0),(QTextStream *)q_ptr);
  std::unique_ptr<QTextStreamPrivate,std::default_delete<QTextStreamPrivate>>::
  unique_ptr<std::default_delete<QTextStreamPrivate>,void>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  data = (QByteArray *)operator_new(0x10);
  QBuffer::QBuffer(in_stack_ffffffffffffffc0,parent);
  device = data;
  QBuffer::setData((QBuffer *)stream,data);
  (*(code *)(data->d).d[6].super_QArrayData.alloc)(data,in_EDX);
  pQVar2 = d_func((QTextStream *)0x4a7987);
  pQVar2->device = (QIODevice *)data;
  pQVar2->deleteDevice = true;
  QDeviceClosedNotifier::setupDevice(in_RDI,stream,(QIODevice *)device);
  pQVar2->status = Ok;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream::QTextStream(const QByteArray &array, OpenMode openMode)
    : d_ptr(new QTextStreamPrivate(this))
{
#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStream::QTextStream(const QByteArray &array == *(%p), openMode = %d)",
           &array, int(openMode.toInt()));
#endif
    QBuffer *buffer = new QBuffer;
    buffer->setData(array);
    buffer->open(openMode);

    Q_D(QTextStream);
    d->device = buffer;
    d->deleteDevice = true;
#ifndef QT_NO_QOBJECT
    d->deviceClosedNotifier.setupDevice(this, d->device);
#endif
    d->status = Ok;
}